

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O2

ChConstraintTwoGeneric * __thiscall
chrono::ChConstraintTwoGeneric::operator=
          (ChConstraintTwoGeneric *this,ChConstraintTwoGeneric *other)

{
  if (other != this) {
    ChConstraintTwo::operator=(&this->super_ChConstraintTwo,&other->super_ChConstraintTwo);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              (&this->Cq_a,&other->Cq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              (&this->Cq_b,&other->Cq_b);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Eq_a,&other->Eq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Eq_b,&other->Eq_b);
  }
  return this;
}

Assistant:

ChConstraintTwoGeneric& ChConstraintTwoGeneric::operator=(const ChConstraintTwoGeneric& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintTwo::operator=(other);

    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;

    return *this;
}